

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# complexwidgets.cpp
# Opt level: O1

QString * __thiscall
QAccessibleTabButton::text(QString *__return_storage_ptr__,QAccessibleTabButton *this,Text t)

{
  char16_t *pcVar1;
  qsizetype qVar2;
  char cVar3;
  QArrayData *pQVar4;
  longlong __tmp;
  long in_FS_OFFSET;
  QString local_60;
  QString local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  cVar3 = (**(code **)(*(long *)this + 0x10))(this);
  if (cVar3 == '\0') {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      (__return_storage_ptr__->d).d = (Data *)0x0;
      (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
      (__return_storage_ptr__->d).size = 0;
      return __return_storage_ptr__;
    }
    goto LAB_00520b43;
  }
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
  switch(t) {
  case Name:
    QTabBar::accessibleTabName(&local_48,(QTabBar *)(this->m_parent).wp.value,this->m_index);
    pQVar4 = &((__return_storage_ptr__->d).d)->super_QArrayData;
    pcVar1 = (__return_storage_ptr__->d).ptr;
    *(undefined4 *)&(__return_storage_ptr__->d).d = local_48.d.d._0_4_;
    *(undefined4 *)((long)&(__return_storage_ptr__->d).d + 4) = local_48.d.d._4_4_;
    *(undefined4 *)&(__return_storage_ptr__->d).ptr = local_48.d.ptr._0_4_;
    *(undefined4 *)((long)&(__return_storage_ptr__->d).ptr + 4) = local_48.d.ptr._4_4_;
    qVar2 = (__return_storage_ptr__->d).size;
    (__return_storage_ptr__->d).size = local_48.d.size;
    local_48.d.d = (Data *)pQVar4;
    local_48.d.ptr = pcVar1;
    local_48.d.size = qVar2;
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar4,2,0x10);
      }
    }
    if ((__return_storage_ptr__->d).size == 0) {
      QTabBar::tabText(&local_60,(QTabBar *)(this->m_parent).wp.value,this->m_index);
      qt_accStripAmp(&local_48,&local_60);
      pQVar4 = &((__return_storage_ptr__->d).d)->super_QArrayData;
      pcVar1 = (__return_storage_ptr__->d).ptr;
      *(undefined4 *)&(__return_storage_ptr__->d).d = local_48.d.d._0_4_;
      *(undefined4 *)((long)&(__return_storage_ptr__->d).d + 4) = local_48.d.d._4_4_;
      *(undefined4 *)&(__return_storage_ptr__->d).ptr = local_48.d.ptr._0_4_;
      *(undefined4 *)((long)&(__return_storage_ptr__->d).ptr + 4) = local_48.d.ptr._4_4_;
      (__return_storage_ptr__->d).size = local_48.d.size;
      local_48.d.size = 0;
      local_48.d.ptr = pcVar1;
      goto LAB_00520ae2;
    }
    break;
  case Description:
    QTabBar::tabToolTip(&local_48,(QTabBar *)(this->m_parent).wp.value,this->m_index);
    goto LAB_00520a50;
  case Help:
    QTabBar::tabWhatsThis(&local_48,(QTabBar *)(this->m_parent).wp.value,this->m_index);
LAB_00520a50:
    local_60.d.d = (__return_storage_ptr__->d).d;
    pcVar1 = (__return_storage_ptr__->d).ptr;
    *(undefined4 *)&(__return_storage_ptr__->d).d = local_48.d.d._0_4_;
    *(undefined4 *)((long)&(__return_storage_ptr__->d).d + 4) = local_48.d.d._4_4_;
    *(undefined4 *)&(__return_storage_ptr__->d).ptr = local_48.d.ptr._0_4_;
    *(undefined4 *)((long)&(__return_storage_ptr__->d).ptr + 4) = local_48.d.ptr._4_4_;
    qVar2 = (__return_storage_ptr__->d).size;
    (__return_storage_ptr__->d).size = local_48.d.size;
    local_48.d.d = local_60.d.d;
    local_48.d.ptr = pcVar1;
    local_48.d.size = qVar2;
    if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
LAB_00520b14:
        QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,2,0x10);
      }
    }
    break;
  case Accelerator:
    QTabBar::tabText(&local_60,(QTabBar *)(this->m_parent).wp.value,this->m_index);
    qt_accHotKey(&local_48,&local_60);
    pQVar4 = &((__return_storage_ptr__->d).d)->super_QArrayData;
    pcVar1 = (__return_storage_ptr__->d).ptr;
    *(undefined4 *)&(__return_storage_ptr__->d).d = local_48.d.d._0_4_;
    *(undefined4 *)((long)&(__return_storage_ptr__->d).d + 4) = local_48.d.d._4_4_;
    *(undefined4 *)&(__return_storage_ptr__->d).ptr = local_48.d.ptr._0_4_;
    *(undefined4 *)((long)&(__return_storage_ptr__->d).ptr + 4) = local_48.d.ptr._4_4_;
    qVar2 = (__return_storage_ptr__->d).size;
    (__return_storage_ptr__->d).size = local_48.d.size;
    local_48.d.ptr = pcVar1;
    local_48.d.size = qVar2;
LAB_00520ae2:
    local_48.d.d = (Data *)pQVar4;
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar4,2,0x10);
      }
    }
    if (&(local_60.d.d)->super_QArrayData == (QArrayData *)0x0) break;
    LOCK();
    ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i != 0) break;
    goto LAB_00520b14;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
LAB_00520b43:
  __stack_chk_fail();
}

Assistant:

QString text(QAccessible::Text t) const override
    {
        if (!isValid())
            return QString();
        QString str;
        switch (t) {
        case QAccessible::Name:
            str = m_parent->accessibleTabName(m_index);
            if (str.isEmpty())
                str = qt_accStripAmp(m_parent->tabText(m_index));
            break;
        case QAccessible::Accelerator:
            str = qt_accHotKey(m_parent->tabText(m_index));
            break;
#if QT_CONFIG(tooltip)
        case QAccessible::Description:
            str = m_parent->tabToolTip(m_index);
            break;
#endif
#if QT_CONFIG(whatsthis)
        case QAccessible::Help:
            str = m_parent->tabWhatsThis(m_index);
            break;
#endif
        default:
            break;
        }
        return str;
    }